

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parse.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_3dd9::Reactor::dictionaryItem(Reactor *this,string *key,JSON *value)

{
  int iVar1;
  ostream *poVar2;
  char *j;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"dictionary item: ",0x11)
  ;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(key->_M_dataplus)._M_p,key->_M_string_length);
  j = " -> ";
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," -> ",4);
  printItem((Reactor *)value,(JSON *)j);
  iVar1 = std::__cxx11::string::compare((char *)key);
  return iVar1 != 0;
}

Assistant:

bool
Reactor::dictionaryItem(std::string const& key, JSON const& value)
{
    std::cout << "dictionary item: " << key << " -> ";
    printItem(value);
    if (key == "keep") {
        return false;
    }
    return true;
}